

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlACatalogResolveSystem(xmlCatalogPtr catal,xmlChar *sysID)

{
  xmlChar *cur;
  xmlChar *sgml;
  xmlChar *ret;
  xmlChar *sysID_local;
  xmlCatalogPtr catal_local;
  
  sgml = (xmlChar *)0x0;
  if ((sysID == (xmlChar *)0x0) || (catal == (xmlCatalogPtr)0x0)) {
    catal_local = (xmlCatalogPtr)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Resolve sysID %s\n",sysID);
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      sgml = xmlCatalogListXMLResolve(catal->xml,(xmlChar *)0x0,sysID);
      if (sgml == (xmlChar *)0xffffffffffffffff) {
        sgml = (xmlChar *)0x0;
      }
    }
    else {
      cur = xmlCatalogGetSGMLSystem(catal->sgml,sysID);
      if (cur != (xmlChar *)0x0) {
        sgml = xmlStrdup(cur);
      }
    }
    catal_local = (xmlCatalogPtr)sgml;
  }
  return (xmlChar *)catal_local;
}

Assistant:

xmlChar *
xmlACatalogResolveSystem(xmlCatalogPtr catal, const xmlChar *sysID) {
    xmlChar *ret = NULL;

    if ((sysID == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Resolve sysID %s\n", sysID);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolve(catal->xml, NULL, sysID);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogGetSGMLSystem(catal->sgml, sysID);
	if (sgml != NULL)
	    ret = xmlStrdup(sgml);
    }
    return(ret);
}